

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O3

bool __thiscall duckdb::InFilter::Equals(InFilter *this,TableFilter *other_p)

{
  pointer pVVar1;
  bool bVar2;
  InFilter *pIVar3;
  pointer this_00;
  pointer rhs;
  
  if ((this->super_TableFilter).filter_type != other_p->filter_type) {
    return false;
  }
  pIVar3 = TableFilter::Cast<duckdb::InFilter>(other_p);
  this_00 = (pIVar3->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar1 = (pIVar3->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  rhs = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start;
  if ((long)pVVar1 - (long)this_00 ==
      (long)(this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)rhs) {
    if (this_00 == pVVar1) {
      bVar2 = true;
    }
    else {
      do {
        bVar2 = Value::operator==(this_00,rhs);
        if (!bVar2) {
          return bVar2;
        }
        this_00 = this_00 + 1;
        rhs = rhs + 1;
      } while (this_00 != pVVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

virtual bool Equals(const TableFilter &other) const {
		return filter_type == other.filter_type;
	}